

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QIBusAttribute>::copyAppend
          (QGenericArrayOps<QIBusAttribute> *this,QIBusAttribute *b,QIBusAttribute *e)

{
  qsizetype *pqVar1;
  QIBusAttribute *pQVar2;
  long lVar3;
  Data *pDVar4;
  Data *pDVar5;
  quint32 qVar6;
  quint32 qVar7;
  quint32 qVar8;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QIBusAttribute>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QIBusAttribute>).size;
      pDVar4 = (b->super_QIBusSerializable).name.d.d;
      pQVar2[lVar3].super_QIBusSerializable.name.d.d = pDVar4;
      pQVar2[lVar3].super_QIBusSerializable.name.d.ptr = (b->super_QIBusSerializable).name.d.ptr;
      pQVar2[lVar3].super_QIBusSerializable.name.d.size = (b->super_QIBusSerializable).name.d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value =
             (Type)((int)(pDVar4->super_QArrayData).ref_._q_value + 1);
        UNLOCK();
      }
      pDVar5 = (b->super_QIBusSerializable).attachments.d;
      pQVar2[lVar3].super_QIBusSerializable.attachments.d = pDVar5;
      if ((pDVar5 != (Data *)0x0) &&
         ((pDVar5->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
        LOCK();
        (pDVar5->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar5->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      qVar6 = b->value;
      qVar7 = b->start;
      qVar8 = b->end;
      pQVar2[lVar3].type = b->type;
      pQVar2[lVar3].value = qVar6;
      pQVar2[lVar3].start = qVar7;
      pQVar2[lVar3].end = qVar8;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QIBusAttribute>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }